

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptGeneratorFunction * __thiscall
Js::JavascriptLibrary::CreateGeneratorFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,
          GeneratorVirtualScriptFunction *scriptFunction)

{
  code *pcVar1;
  GeneratorVirtualScriptFunction *entrypoint;
  bool bVar2;
  byte bVar3;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptGeneratorFunction *this_02;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_51;
  TrackAllocData local_50;
  DynamicType *local_28;
  DynamicType *type;
  GeneratorVirtualScriptFunction *scriptFunction_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  type = (DynamicType *)scriptFunction;
  scriptFunction_local = (GeneratorVirtualScriptFunction *)entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar2 = ScriptConfiguration::IsES6GeneratorsEnabled(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x19ad,"(scriptContext->GetConfig()->IsES6GeneratorsEnabled())",
                                "scriptContext->GetConfig()->IsES6GeneratorsEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  entrypoint = scriptFunction_local;
  bVar3 = (**(code **)(*(long *)&type->super_Type + 0x3b8))();
  local_28 = CreateDeferredPrototypeGeneratorFunctionType
                       (this,(JavascriptMethod)entrypoint,(bool)(bVar3 & 1),false);
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&JavascriptGeneratorFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19b1);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_50);
  this_02 = (JavascriptGeneratorFunction *)new<(Memory::ObjectInfoBits)1>(0x38,pRVar5,&local_51);
  JavascriptGeneratorFunction::JavascriptGeneratorFunction
            (this_02,local_28,(GeneratorVirtualScriptFunction *)type);
  return this_02;
}

Assistant:

JavascriptGeneratorFunction* JavascriptLibrary::CreateGeneratorFunction(JavascriptMethod entryPoint, GeneratorVirtualScriptFunction* scriptFunction)
    {
        Assert(scriptContext->GetConfig()->IsES6GeneratorsEnabled());

        DynamicType* type = CreateDeferredPrototypeGeneratorFunctionType(entryPoint, scriptFunction->IsAnonymousFunction());

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptGeneratorFunction, type, scriptFunction);
    }